

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O0

int __thiscall wasm::ShellExternalInterface::init(ShellExternalInterface *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  ModuleRunner *instance_local;
  Module *wasm_local;
  ShellExternalInterface *this_local;
  
  wasm::ModuleUtils::
  iterDefinedMemories<wasm::ShellExternalInterface::init(wasm::Module&,wasm::ModuleRunner&)::_lambda(wasm::Memory*)_1_>
            ((Module *)ctx,(anon_class_8_1_8991fb9c)this);
  wasm::ModuleUtils::
  iterDefinedTables<wasm::ShellExternalInterface::init(wasm::Module&,wasm::ModuleRunner&)::_lambda(wasm::Table*)_1_>
            ((Module *)ctx,(anon_class_8_1_8991fb9c)this);
  return extraout_EAX;
}

Assistant:

void init(Module& wasm, ModuleRunner& instance) override {
    ModuleUtils::iterDefinedMemories(wasm, [&](wasm::Memory* memory) {
      auto shellMemory = Memory();
      shellMemory.resize(memory->initial * wasm::Memory::kPageSize);
      memories[memory->name] = shellMemory;
    });
    ModuleUtils::iterDefinedTables(
      wasm, [&](Table* table) { tables[table->name].resize(table->initial); });
  }